

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlConvertSGMLCatalog(xmlCatalogPtr catal)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlCatalogPtr catal_local;
  
  iVar2 = -1;
  if ((catal != (xmlCatalogPtr)0x0) && (catal->type == XML_SGML_CATALOG_TYPE)) {
    catal_local = catal;
    if (xmlDebugCatalogs != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Converting SGML catalog to XML\n");
    }
    xmlHashScan(catal->sgml,xmlCatalogConvertEntry,&catal_local);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
xmlConvertSGMLCatalog(xmlCatalogPtr catal) {

    if ((catal == NULL) || (catal->type != XML_SGML_CATALOG_TYPE))
	return(-1);

    if (xmlDebugCatalogs) {
	xmlGenericError(xmlGenericErrorContext,
		"Converting SGML catalog to XML\n");
    }
    xmlHashScan(catal->sgml, xmlCatalogConvertEntry, &catal);
    return(0);
}